

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_peek_next_line(Parser *this,size_t pos)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  yml *pyVar5;
  size_t len_;
  size_t extraout_RDX;
  char *pcVar6;
  ro_substr chars;
  csubstr cVar7;
  csubstr cVar8;
  basic_substring<const_char> local_28;
  basic_substring<char> local_18;
  
  local_28 = (basic_substring<const_char>)ZEXT816(0);
  if (pos == 0xffffffffffffffff) {
    pos = (this->m_state->pos).super_LineCol.offset;
  }
  uVar1 = (this->m_buf).len;
  len_ = uVar1 - pos;
  pyVar5 = (yml *)0x0;
  pcVar6 = (char *)0x0;
  if (pos <= uVar1 && len_ != 0) {
    basic_substring<char>::basic_substring(&local_18,(this->m_buf).str + pos,len_);
    cVar8.len = extraout_RDX;
    cVar8.str = (char *)local_18.len;
    local_28 = from_next_line((yml *)local_18.str,cVar8);
    pyVar5 = (yml *)0x0;
    pcVar6 = (char *)0x0;
    if (local_28.str != (char *)0x0 && local_28.len != 0) {
      chars.len = 2;
      chars.str = "\r\n";
      pcVar4 = (char *)basic_substring<const_char>::first_of(&local_28,chars,0);
      pyVar5 = (yml *)local_28.str;
      pcVar6 = (char *)local_28.len;
      if (pcVar4 != (char *)0xffffffffffffffff) {
        if (pcVar4 + 1 < local_28.len) {
          pcVar4 = pcVar4 + (((yml *)(local_28.str + 1))[(long)pcVar4] == (yml)0xa &&
                             *(yml *)(local_28.str + (long)pcVar4) == (yml)0xd ||
                            ((yml *)(local_28.str + 1))[(long)pcVar4] == (yml)0xd &&
                            *(yml *)(local_28.str + (long)pcVar4) == (yml)0xa);
        }
        if (local_28.len < pcVar4) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            cVar8 = (csubstr)(*pcVar2)();
            return cVar8;
          }
          handle_error(0x1e5106,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1572,"pos <= len || pos == npos");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)&local_18,local_28.str,(size_t)(pcVar4 + 1));
        pyVar5 = (yml *)local_18.str;
        pcVar6 = (char *)local_18.len;
      }
    }
  }
  cVar7.len = (size_t)pcVar6;
  cVar7.str = (char *)pyVar5;
  return cVar7;
}

Assistant:

constexpr basic_substring(basic_substring const&) = default;